

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O2

_Bool borg_flow_kill(_Bool viewable,wchar_t nearness)

{
  long lVar1;
  wchar_t x;
  wchar_t y;
  uint uVar2;
  loc_conflict grid1;
  bool bVar3;
  chunk_conflict *c;
  _Bool _Var4;
  ushort uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  loc_conflict grid2;
  loc grid;
  bool bVar8;
  uint uVar9;
  wchar_t wVar10;
  uint uVar11;
  borg_kill *pbVar12;
  int iVar13;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  wchar_t local_60;
  
  if ((borg_kills_cnt != 0) &&
     (((borg.trait[0x69] != 0 || (0x13 < borg.trait[0x23])) || (borg_cfg[0x18] != 0)))) {
    if ((borg.trait[0x19] == 4) || (borg.trait[0x19] == 1)) {
      iVar13 = 0x23;
      if (borg.trait[0x69] == 0) {
        iVar13 = 0x19;
      }
      if (borg.trait[0x23] < iVar13) {
        return false;
      }
    }
    if (((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) &&
       ((borg.trait[0x27] != 0 && (!borg_morgoth_position)))) {
      borg_temp_n = 0;
      iVar13 = 0;
      bVar14 = false;
      for (lVar15 = -1; lVar19 = -1, lVar15 != 2; lVar15 = lVar15 + 1) {
        for (; lVar19 != 2; lVar19 = lVar19 + 1) {
          if ((borg_grids[borg.c.y + lVar19][lVar15 + borg.c.x].glyph != false) ||
             ((byte)(borg_grids[borg.c.y + lVar19][lVar15 + borg.c.x].feat - 0x11) < 6)) {
            iVar13 = iVar13 + 1;
          }
          bVar14 = (bool)(bVar14 | 4 < iVar13);
        }
      }
      uVar16 = 0xffffffffffffffff;
      local_60 = L'\xffffffff';
      for (uVar17 = 0; (long)uVar17 < (long)track_less.num; uVar17 = uVar17 + 1) {
        grid2 = loc(track_less.x[uVar17],track_less.y[uVar17]);
        grid1.y = borg.c.y;
        grid1.x = borg.c.x;
        wVar6 = distance(grid1,grid2);
        if (local_60 < wVar6) {
          uVar16 = uVar17;
        }
        uVar16 = uVar16 & 0xffffffff;
        if (local_60 <= wVar6) {
          local_60 = wVar6;
        }
      }
      wVar6 = (wchar_t)uVar16;
      bVar8 = false;
      for (lVar15 = 1; lVar15 < borg_kills_nxt; lVar15 = lVar15 + 1) {
        if ((ulong)borg_kills[lVar15].r_idx != 0) {
          pbVar12 = borg_kills + lVar15;
          uVar9 = (pbVar12->pos).x - borg.c.x;
          uVar2 = -uVar9;
          if (0 < (int)uVar9) {
            uVar2 = uVar9;
          }
          uVar11 = (pbVar12->pos).y - borg.c.y;
          uVar9 = -uVar11;
          if (0 < (int)uVar11) {
            uVar9 = uVar11;
          }
          if (uVar9 < uVar2) {
            uVar9 = uVar2;
          }
          if ((((uVar9 != 1) || ((borg.trait[0x71] == 0 && (borg.trait[0xba] == 0)))) &&
              ((borg.goal.ignoring != true ||
               ((borg.trait[0x71] != 0 ||
                (_Var4 = flag_has_dbg(r_info[borg_kills[lVar15].r_idx].flags,0xb,0x11,
                                      "r_info[kill->r_idx].flags","RF_MULTIPLY"), !_Var4)))))) &&
             (((9 < borg.trait[0x24] ||
               (_Var4 = flag_has_dbg(r_info[pbVar12->r_idx].flags,0xb,0x15,
                                     "r_info[kill->r_idx].flags","RF_NEVER_MOVE"), !_Var4)) &&
              (scaryguy_on_level == false)))) {
            uVar5 = pbVar12->r_idx;
            if (borg.trait[0x23] < 10) {
              _Var4 = flag_has_dbg(r_info[uVar5].flags,0xb,0x11,"r_info[kill->r_idx].flags",
                                   "RF_MULTIPLY");
              if (_Var4) goto LAB_00208805;
              uVar5 = pbVar12->r_idx;
            }
            _Var4 = flag_has_dbg(r_info[uVar5].flags,0xb,1,"r_info[kill->r_idx].flags","RF_UNIQUE");
            if (((!_Var4) || (borg.trait[0x69] != 0)) || (4 < borg.trait[0x23])) {
              x = (pbVar12->pos).x;
              y = (pbVar12->pos).y;
              if (((!viewable) || ((borg_grids[y][x].info & 0x20) != 0)) &&
                 ((wVar7 = borg_danger(y,x,L'\x01',true,false), borg.trait[0x23] < 0x1a ||
                  ((_Var4 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE"), _Var4 ||
                   (wVar7 <= avoidance / 2)))))) {
                if (borg.trait[0x23] < 0x10) {
                  if (avoidance / 3 < wVar7) goto LAB_00208805;
                  if (borg.trait[0x23] < 10 && wVar6 != L'\xffffffff') {
                    wVar7 = borg_distance(track_less.y[wVar6],track_less.x[wVar6],y,x);
                    wVar10 = borg.trait[0x23] * 5 + L'\t';
                    if ((local_60 <= wVar10) && (wVar10 <= wVar7)) goto LAB_00208805;
                  }
                }
                if ((bVar14) &&
                   (_Var4 = flag_has_dbg(r_info[pbVar12->r_idx].flags,0xb,5,
                                         "r_info[kill->r_idx].flags","RF_GROUP_AI"), _Var4)) {
                  for (lVar19 = -1; lVar19 != 2; lVar19 = lVar19 + 1) {
                    lVar1 = lVar19 + x;
                    for (lVar18 = -1; c = cave, lVar18 != 2; lVar18 = lVar18 + 1) {
                      grid = (loc)loc((int)lVar1,y + (int)lVar18);
                      _Var4 = square_in_bounds_fully(c,grid);
                      if (_Var4) {
                        if ((borg_grids[y + lVar18][lVar1].glyph != false) ||
                           ((byte)(borg_grids[y + lVar18][lVar1].feat - 0x11) < 6)) {
                          iVar13 = iVar13 + 1;
                        }
                        bVar8 = (bool)(bVar8 | iVar13 < 4);
                      }
                    }
                  }
                }
                if ((uVar9 == 2) && (pbVar12->ranged_attack == '\0')) {
                  _Var4 = flag_has_dbg(r_info[pbVar12->r_idx].flags,0xb,0x15,
                                       "r_info[kill->r_idx].flags","RF_NEVER_MOVE");
                  bVar3 = !bVar8;
                  bVar8 = true;
                  if ((~_Var4 & 1U) == 0 && bVar3) {
LAB_00208bb5:
                    _Var4 = borg_flow_far_from_stairs(x,y,wVar6);
                    if (!_Var4) {
                      borg_temp_x[borg_temp_n] = (uint8_t)x;
                      borg_temp_y[borg_temp_n] = (uint8_t)y;
                      borg_temp_n = borg_temp_n + 1;
                    }
                    bVar8 = false;
                  }
                }
                else {
                  if (!bVar8) goto LAB_00208bb5;
                  bVar8 = true;
                }
              }
            }
          }
        }
LAB_00208805:
      }
      if (borg_temp_n != 0) {
        borg_flow_clear();
        for (lVar15 = 0; lVar15 < borg_temp_n; lVar15 = lVar15 + 1) {
          borg_flow_enqueue_grid((uint)borg_temp_y[lVar15],(uint)borg_temp_x[lVar15]);
        }
        borg_flow_spread(nearness,true,!viewable,false,L'\xffffffff',false);
        _Var4 = borg_flow_commit("kill",L'\x01');
        if (_Var4) {
          _Var4 = borg_flow_old(L'\x01');
          return _Var4;
        }
      }
    }
  }
  return false;
}

Assistant:

bool borg_flow_kill(bool viewable, int nearness)
{
    int i, x, y, p, j, b_j = -1;
    int b_stair       = -1;

    bool borg_in_hall = false;
    int  hall_y, hall_x, hall_walls = 0;
    bool skip_monster = false;

    borg_grid *ag;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Don't chase down town monsters when you are just starting out */
    if (borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 20
        && !borg_cfg[BORG_MONEY_SCUM_AMOUNT])
        return false;

    /* YOU ARE NOT A WARRIOR!! DON'T ACT LIKE ONE!! */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        && borg.trait[BI_CLEVEL] < (borg.trait[BI_CDEPTH] ? 35 : 25))
        return false;

    /* Not if Weak from hunger or no food */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]
        || borg.trait[BI_FOOD] == 0)
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;

    /* Nothing found */
    borg_temp_n = 0;

    /* check to see if in a hall, used later */
    for (hall_x = -1; hall_x <= 1; hall_x++) {
        for (hall_y = -1; hall_y <= 1; hall_y++) {
            /* Acquire location */
            x  = hall_x + borg.c.x;
            y  = hall_y + borg.c.y;

            ag = &borg_grids[y][x];

            /* track walls */
            if ((ag->glyph)
                || ((ag->feat >= FEAT_MAGMA) && (ag->feat <= FEAT_PERM))) {
                hall_walls++;
            }

            /* addem up */
            if (hall_walls >= 5)
                borg_in_hall = true;
        }
    }

    /* Check distance away from stairs, used later */

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the monster list */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];
        int        x9   = kill->pos.x;
        int        y9   = kill->pos.y;
        int        ax, ay, d;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* don't bother flowing to an adjacent monster when I am afraid */
        if (d == 1 && (borg.trait[BI_ISAFRAID] || borg.trait[BI_CRSFEAR]))
            continue;

        /* Ignore multiplying monsters */
        if (borg.goal.ignoring && !borg.trait[BI_ISAFRAID]
            && (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY)))
            continue;

        /* Ignore molds when low level */
        if (borg.trait[BI_MAXCLEVEL] < 10
            && (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE)))
            continue;

        /* Avoid flowing to a fight if a scary guy is on the level */
        if (scaryguy_on_level)
            continue;

        /* Avoid multiplying monsters when low level */
        if (borg.trait[BI_CLEVEL] < 10
            && (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY)))
            continue;

        /* Hack -- ignore Maggot until later.  Player will chase Maggot
         * down all across the screen waking up all the monsters.  Then
         * he is stuck in a compromised situation.
         */
        if ((rf_has(r_info[kill->r_idx].flags, RF_UNIQUE))
            && borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 5)
            continue;

        /* Access the location */
        x = kill->pos.x;
        y = kill->pos.y;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* Calculate danger */
        p = borg_danger(y, x, 1, true, false);

        /* Hack -- Skip "deadly" monsters unless uniques*/
        if (borg.trait[BI_CLEVEL] > 25 && (!rf_has(r_info->flags, RF_UNIQUE))
            && p > avoidance / 2)
            continue;
        if (borg.trait[BI_CLEVEL] <= 15 && p > avoidance / 3)
            continue;

        /* Skip ones that make me wander too far */
        if (b_stair != -1 && borg.trait[BI_CLEVEL] < 10) {
            /* Check the distance of this monster to the stair */
            j = borg_distance(
                track_less.y[b_stair], track_less.x[b_stair], y, x);
            /* skip far away monsters while I am close to stair */
            if (b_j <= borg.trait[BI_CLEVEL] * 5 + 9
                && j >= borg.trait[BI_CLEVEL] * 5 + 9)
                continue;
        }

        /* Hack -- Avoid getting surrounded */
        if (borg_in_hall && (rf_has(r_info[kill->r_idx].flags, RF_GROUP_AI))) {
            /* check to see if monster is in a hall, */
            for (hall_x = -1; hall_x <= 1; hall_x++) {
                for (hall_y = -1; hall_y <= 1; hall_y++) {
                    if (!square_in_bounds_fully(
                            cave, loc(hall_x + x, hall_y + y)))
                        continue;
                    ag = &borg_grids[hall_y + y][hall_x + x];

                    /* track walls */
                    if ((ag->glyph)
                        || ((ag->feat >= FEAT_MAGMA)
                            && (ag->feat <= FEAT_PERM))) {
                        hall_walls++;
                    }

                    /* we want the monster to be in a hall also
                     *
                     *  ########################
                     *  ############      S  ###
                     *  #         @'     SSS ###
                     *  # ##########       SS###
                     *  # #        #       Ss###
                     *  # #        ###### ######
                     *  # #             # #
                     * Currently, we would like the borg to avoid
                     * flowing to a situation like the one above.
                     * We would like him to stay in the hall and
                     * attack from a distance.  One problem is the
                     * lower case 's' in the corner, He will show
                     * up as being in a corner, and the borg may
                     * flow to it.  Let's hope that is a rare case.
                     *
                     * The borg might flow to the 'dark' south exit
                     * of the room.  This would be dangerous for
                     * him as well.
                     */
                    /* add 'em up */
                    if (hall_walls < 4) {
                        /* This monster is not in a hallway.
                         * It may not be safe to fight.
                         */
                        skip_monster = true;
                    }
                }
            }
        }

        /* Skip this one if it is just 2 grids from me and it can attack me as
         * soon as I move 1 grid closer to it.  Note that some monsters are
         * faster than me and it could still cover the 1 grid and hit me. I'll
         * fix it (based on my speed) later XXX
         */
        if (d == 2 && /* Spacing is important */
            (!(kill->ranged_attack)) && /* Ranged Attacks, don't rest. */
            (!(rf_has(r_info[kill->r_idx].flags,
                RF_NEVER_MOVE)))) /* Skip monsters that dont chase */
        {
            skip_monster = true;
        }

        /* skip certain ones */
        if (skip_monster)
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to kill */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to kill */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward monsters that we can see, make sure they */
    /* are at least easily reachable.  The second flag is whether or not */
    /* to avoid unknown squares.  This was for performance when we have ESP. */
    borg_flow_spread(nearness, true, !viewable, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("kill", GOAL_KILL))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_KILL))
        return false;

    /* Success */
    return true;
}